

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::base64_encode(string *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cVar2 = (char)__return_storage_ptr__;
  if (in->_M_string_length == 0) {
    iVar5 = -6;
  }
  else {
    pcVar1 = (in->_M_dataplus)._M_p;
    pcVar3 = pcVar1 + in->_M_string_length;
    iVar5 = -6;
    do {
      if (iVar5 < -8) {
        iVar5 = iVar5 + 8;
      }
      else {
        iVar4 = iVar5 + 0xe;
        do {
          iVar5 = iVar4;
          std::__cxx11::string::push_back(cVar2);
          iVar4 = iVar5 + -6;
        } while (5 < iVar4);
        iVar5 = iVar5 + -0xc;
      }
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != pcVar3);
  }
  if (-6 < iVar5) {
    std::__cxx11::string::push_back(cVar2);
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64_encode(const std::string &in) {
			static const auto lookup =
					"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

			std::string out;
			out.reserve(in.size());

			int val = 0;
			int valb = -6;

			for (auto c : in) {
				val = (val << 8) + static_cast<uint8_t>(c);
				valb += 8;
				while (valb >= 0) {
					out.push_back(lookup[(val >> valb) & 0x3F]);
					valb -= 6;
				}
			}

			if (valb > -6) { out.push_back(lookup[((val << 8) >> (valb + 8)) & 0x3F]); }

			while (out.size() % 4) {
				out.push_back('=');
			}

			return out;
		}